

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

uint64_t xxh3(void *data,size_t len,uint64_t seed)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ulong uVar11;
  uint64_t k1;
  uint64_t v4;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint8_t *limit;
  uint64_t h64;
  uint8_t *end;
  uint8_t *p;
  uint64_t seed_local;
  size_t len_local;
  void *data_local;
  
  puVar2 = (uint8_t *)((long)data + len);
  end = (uint8_t *)data;
  if (len < 0x20) {
    limit = (uint8_t *)(seed + 0x27d4eb2f165667c5);
  }
  else {
    v2 = seed + 0x60ea27eeadc0b5d6;
    v3 = seed + 0xc2b2ae3d27d4eb4f;
    k1 = seed + 0x61c8864e7a143579;
    v4 = seed;
    do {
      uVar3 = XXH_read64(end);
      uVar3 = XXH_rotl64(uVar3 * -0x3d4d51c2d82b14b1 + v2,0x1f);
      v2 = uVar3 * -0x61c8864e7a143579;
      uVar4 = XXH_read64(end + 8);
      uVar4 = XXH_rotl64(uVar4 * -0x3d4d51c2d82b14b1 + v3,0x1f);
      v3 = uVar4 * -0x61c8864e7a143579;
      uVar5 = XXH_read64(end + 0x10);
      uVar5 = XXH_rotl64(uVar5 * -0x3d4d51c2d82b14b1 + v4,0x1f);
      v4 = uVar5 * -0x61c8864e7a143579;
      uVar6 = XXH_read64(end + 0x18);
      uVar6 = XXH_rotl64(uVar6 * -0x3d4d51c2d82b14b1 + k1,0x1f);
      k1 = uVar6 * -0x61c8864e7a143579;
      end = end + 0x20;
    } while (end <= puVar2 + -0x20);
    uVar7 = XXH_rotl64(v2,1);
    uVar8 = XXH_rotl64(v3,7);
    uVar9 = XXH_rotl64(v4,0xc);
    uVar10 = XXH_rotl64(k1,0x12);
    uVar3 = XXH_rotl64(uVar3 * -0x210ca4fef0869357,0x1f);
    uVar4 = XXH_rotl64(uVar4 * -0x210ca4fef0869357,0x1f);
    uVar5 = XXH_rotl64(uVar5 * -0x210ca4fef0869357,0x1f);
    uVar6 = XXH_rotl64(uVar6 * -0x210ca4fef0869357,0x1f);
    limit = (uint8_t *)
            ((uVar6 * -0x61c8864e7a143579 ^
             (uVar5 * -0x61c8864e7a143579 ^
             (uVar4 * -0x61c8864e7a143579 ^
             (uVar3 * -0x61c8864e7a143579 ^ uVar7 + uVar8 + uVar9 + uVar10) * -0x61c8864e7a143579 +
             0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
             0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  }
  limit = limit + len;
  for (; end + 8 <= puVar2; end = end + 8) {
    uVar3 = XXH_read64(end);
    uVar3 = XXH_rotl64(uVar3 * -0x3d4d51c2d82b14b1,0x1f);
    uVar3 = XXH_rotl64(uVar3 * -0x61c8864e7a143579 ^ (ulong)limit,0x1b);
    limit = (uint8_t *)(uVar3 * -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  }
  if (end + 4 <= puVar2) {
    uVar1 = XXH_read32(end);
    uVar3 = XXH_rotl64((ulong)uVar1 * -0x61c8864e7a143579 ^ (ulong)limit,0x17);
    limit = (uint8_t *)(uVar3 * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9);
    end = end + 4;
  }
  for (; end < puVar2; end = end + 1) {
    uVar3 = XXH_rotl64((ulong)*end * 0x27d4eb2f165667c5 ^ (ulong)limit,0xb);
    limit = (uint8_t *)(uVar3 * -0x61c8864e7a143579);
  }
  uVar11 = ((ulong)limit >> 0x21 ^ (ulong)limit) * -0x3d4d51c2d82b14b1;
  uVar11 = (uVar11 >> 0x1d ^ uVar11) * 0x165667b19e3779f9;
  return uVar11 >> 0x20 ^ uVar11;
}

Assistant:

static uint64_t xxh3(const void* data, size_t len, uint64_t seed) {
    const uint8_t* p = (const uint8_t*)data;
    const uint8_t* const end = p + len;
    uint64_t h64;

    if (len >= 32) {
        const uint8_t* const limit = end - 32;
        uint64_t v1 = seed + XXH_PRIME_1 + XXH_PRIME_2;
        uint64_t v2 = seed + XXH_PRIME_2;
        uint64_t v3 = seed + 0;
        uint64_t v4 = seed - XXH_PRIME_1;

        do {
            v1 += XXH_read64(p) * XXH_PRIME_2;
            v1 = XXH_rotl64(v1, 31);
            v1 *= XXH_PRIME_1;

            v2 += XXH_read64(p + 8) * XXH_PRIME_2;
            v2 = XXH_rotl64(v2, 31);
            v2 *= XXH_PRIME_1;

            v3 += XXH_read64(p + 16) * XXH_PRIME_2;
            v3 = XXH_rotl64(v3, 31);
            v3 *= XXH_PRIME_1;

            v4 += XXH_read64(p + 24) * XXH_PRIME_2;
            v4 = XXH_rotl64(v4, 31);
            v4 *= XXH_PRIME_1;

            p += 32;
        } while (p <= limit);

        h64 = XXH_rotl64(v1, 1) + XXH_rotl64(v2, 7) + XXH_rotl64(v3, 12) + 
            XXH_rotl64(v4, 18);

        v1 *= XXH_PRIME_2;
        v1 = XXH_rotl64(v1, 31);
        v1 *= XXH_PRIME_1;
        h64 ^= v1;
        h64 = h64 * XXH_PRIME_1 + XXH_PRIME_4;

        v2 *= XXH_PRIME_2;
        v2 = XXH_rotl64(v2, 31);
        v2 *= XXH_PRIME_1;
        h64 ^= v2;
        h64 = h64 * XXH_PRIME_1 + XXH_PRIME_4;

        v3 *= XXH_PRIME_2;
        v3 = XXH_rotl64(v3, 31);
        v3 *= XXH_PRIME_1;
        h64 ^= v3;
        h64 = h64 * XXH_PRIME_1 + XXH_PRIME_4;

        v4 *= XXH_PRIME_2;
        v4 = XXH_rotl64(v4, 31);
        v4 *= XXH_PRIME_1;
        h64 ^= v4;
        h64 = h64 * XXH_PRIME_1 + XXH_PRIME_4;
    }
    else {
        h64 = seed + XXH_PRIME_5;
    }

    h64 += (uint64_t)len;

    while (p + 8 <= end) {
        uint64_t k1 = XXH_read64(p);
        k1 *= XXH_PRIME_2;
        k1 = XXH_rotl64(k1, 31);
        k1 *= XXH_PRIME_1;
        h64 ^= k1;
        h64 = XXH_rotl64(h64, 27) * XXH_PRIME_1 + XXH_PRIME_4;
        p += 8;
    }

    if (p + 4 <= end) {
        h64 ^= (uint64_t)(XXH_read32(p)) * XXH_PRIME_1;
        h64 = XXH_rotl64(h64, 23) * XXH_PRIME_2 + XXH_PRIME_3;
        p += 4;
    }

    while (p < end) {
        h64 ^= (*p) * XXH_PRIME_5;
        h64 = XXH_rotl64(h64, 11) * XXH_PRIME_1;
        p++;
    }

    h64 ^= h64 >> 33;
    h64 *= XXH_PRIME_2;
    h64 ^= h64 >> 29;
    h64 *= XXH_PRIME_3;
    h64 ^= h64 >> 32;

    return h64;
}